

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webvttparser.cc
# Opt level: O3

bool __thiscall libwebvtt::Time::operator==(Time *this,Time *rhs)

{
  undefined1 auVar1 [16];
  
  auVar1[0] = -((char)rhs->hours == (char)this->hours);
  auVar1[1] = -(*(char *)((long)&rhs->hours + 1) == *(char *)((long)&this->hours + 1));
  auVar1[2] = -(*(char *)((long)&rhs->hours + 2) == *(char *)((long)&this->hours + 2));
  auVar1[3] = -(*(char *)((long)&rhs->hours + 3) == *(char *)((long)&this->hours + 3));
  auVar1[4] = -((char)rhs->minutes == (char)this->minutes);
  auVar1[5] = -(*(char *)((long)&rhs->minutes + 1) == *(char *)((long)&this->minutes + 1));
  auVar1[6] = -(*(char *)((long)&rhs->minutes + 2) == *(char *)((long)&this->minutes + 2));
  auVar1[7] = -(*(char *)((long)&rhs->minutes + 3) == *(char *)((long)&this->minutes + 3));
  auVar1[8] = -((char)rhs->seconds == (char)this->seconds);
  auVar1[9] = -(*(char *)((long)&rhs->seconds + 1) == *(char *)((long)&this->seconds + 1));
  auVar1[10] = -(*(char *)((long)&rhs->seconds + 2) == *(char *)((long)&this->seconds + 2));
  auVar1[0xb] = -(*(char *)((long)&rhs->seconds + 3) == *(char *)((long)&this->seconds + 3));
  auVar1[0xc] = -((char)rhs->milliseconds == (char)this->milliseconds);
  auVar1[0xd] = -(*(char *)((long)&rhs->milliseconds + 1) ==
                 *(char *)((long)&this->milliseconds + 1));
  auVar1[0xe] = -(*(char *)((long)&rhs->milliseconds + 2) ==
                 *(char *)((long)&this->milliseconds + 2));
  auVar1[0xf] = -(*(char *)((long)&rhs->milliseconds + 3) ==
                 *(char *)((long)&this->milliseconds + 3));
  return (ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) | (ushort)(SUB161(auVar1 >> 0xf,0) & 1) << 1 |
                  (ushort)(SUB161(auVar1 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar1 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar1 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar1 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar1 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar1 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar1 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar1 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar1 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar1 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar1 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar1 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar1 >> 0x77,0) & 1) << 0xe | (ushort)(auVar1[0xf] >> 7) << 0xf)
         == 0xffff;
}

Assistant:

bool Time::operator==(const Time& rhs) const {
  if (hours != rhs.hours)
    return false;

  if (minutes != rhs.minutes)
    return false;

  if (seconds != rhs.seconds)
    return false;

  return (milliseconds == rhs.milliseconds);
}